

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_454c1b::QDynamicBufferResourceRoot::registerSelf
          (QDynamicBufferResourceRoot *this,uchar *b,qsizetype size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  if ((((0x13 < (ulong)size) && (*b == 'q')) && (b[1] == 'r')) && ((b[2] == 'e' && (b[3] == 's'))))
  {
    uVar2 = *(uint *)(b + 4);
    uVar3 = *(uint *)(b + 8);
    uVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = *(uint *)(b + 0xc);
    uVar4 = *(uint *)(b + 0x10);
    bVar5 = true;
    if (2 < (int)uVar1) {
      bVar5 = (*(uint *)(b + 0x14) & 0xfaffffff) == 0;
    }
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    if (-1 < size) {
      bVar5 = (bool)(((int)uVar4 < size && ((int)uVar2 < size && (int)uVar3 < size)) & bVar5);
    }
    if ((bVar5) && (uVar1 - 1 < 3)) {
      this->buffer = b;
      (this->super_QResourceRoot).tree = b + (int)uVar3;
      (this->super_QResourceRoot).names = b + (int)uVar4;
      (this->super_QResourceRoot).payloads = b + (int)uVar2;
      (this->super_QResourceRoot).version = uVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool registerSelf(const uchar *b, qsizetype size)
    {
        // 5 int "pointers"
        if (size >= 0 && size < 20)
            return false;

        // setup the data now
        int offset = 0;

        // magic number
        if (b[offset + 0] != 'q' || b[offset + 1] != 'r' || b[offset + 2] != 'e'
            || b[offset + 3] != 's') {
            return false;
        }
        offset += 4;

        const int version = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int tree_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int data_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int name_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        quint32 file_flags = 0;
        if (version >= 3) {
            file_flags = qFromBigEndian<qint32>(b + offset);
            offset += 4;
        }

        // Some sanity checking for sizes. This is _not_ a security measure.
        if (size >= 0 && (tree_offset >= size || data_offset >= size || name_offset >= size))
            return false;

        // And some sanity checking for features
        quint32 acceptableFlags = 0;
#ifndef QT_NO_COMPRESS
        acceptableFlags |= Compressed;
#endif
        if (QT_CONFIG(zstd))
            acceptableFlags |= CompressedZstd;
        if (file_flags & ~acceptableFlags)
            return false;

        if (version >= 0x01 && version <= 0x03) {
            buffer = b;
            setSource(version, b + tree_offset, b + name_offset, b + data_offset);
            return true;
        }
        return false;
    }